

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::iterate(TessellationShaderTCTEgl_TessLevel *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  float *pfVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  MessageBuilder *pMVar8;
  TestError *pTVar9;
  long lVar10;
  pointer p_Var11;
  char *msg;
  float *value;
  uint uVar12;
  float fVar14;
  float fVar15;
  float outer_level1_clamped;
  float outer_level0_clamped;
  float local_1e8;
  float fStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined8 local_1d8;
  string vertex_spacing_mode_string;
  undefined1 local_1b0 [384];
  long lVar5;
  ulong uVar13;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  initTest(this);
  (**(code **)(lVar5 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPatchParameteriEXT() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdd4);
  (**(code **)(lVar5 + 0x5e0))(0x8c89);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdd8);
  p_Var11 = (this->m_tests).
            super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (p_Var11 ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      lVar6 = lVar10 * 0x18;
      local_1d8 = (&DAT_017b8b90)[lVar10 * 3];
      local_1e8 = *(float *)(&DAT_017b8b98 + lVar6);
      fStack_1e4 = *(float *)(&UNK_017b8b9c + lVar6);
      uStack_1e0 = *(undefined4 *)(&UNK_017b8ba0 + lVar6);
      uStack_1dc = *(undefined4 *)(&UNK_017b8ba4 + lVar6);
      (**(code **)(lVar5 + 0x1680))(p_Var11->po_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glUseProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xdf3);
      if (p_Var11->type == TESSELLATION_TEST_TYPE_TES) {
        uVar12 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
        if ((uVar12 & 0x300) != 0) {
          (**(code **)(lVar5 + 0xfd0))(0x8e73,&local_1d8);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,
                          "glPatchParameterfv() call failed for GL_PATCH_DEFAULT_INNER_LEVEL pname",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                          ,0xe0b);
          (**(code **)(lVar5 + 0xfd0))(0x8e74,&local_1e8);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          msg = "glPatchParameterfv() call failed for GL_PATCH_DEFAULT_OUTER_LEVEL pname";
          iVar3 = 0xe10;
          goto LAB_00d1f223;
        }
      }
      else {
        if (p_Var11->type != TESSELLATION_TEST_TYPE_FIRST) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Unrecognized test type",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xe17);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar5 + 0x1528))(p_Var11->inner_tess_levels_uniform_location,1,&local_1d8);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glUniform2fv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xdfb);
        (**(code **)(lVar5 + 0x15a8))(p_Var11->outer_tess_levels_uniform_location,1,&local_1e8);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        msg = "glUniform4fv() call failed";
        iVar3 = 0xdff;
LAB_00d1f223:
        glu::checkError(dVar4,msg,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,iVar3);
      }
      outer_level0_clamped = 0.0;
      outer_level1_clamped = 0.0;
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                (TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,local_1e8,
                 this->m_gl_max_tess_gen_level_value,(float *)0x0,&outer_level0_clamped);
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                (p_Var11->vertex_spacing,fStack_1e4,this->m_gl_max_tess_gen_level_value,(float *)0x0
                 ,&outer_level1_clamped);
      uVar12 = (int)(long)(outer_level1_clamped + 1.0) * (int)(long)outer_level0_clamped * 0x18;
      uVar13 = (ulong)uVar12;
      (**(code **)(lVar5 + 0x150))(0x8c8e,uVar13,0,0x88e4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBufferData() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe37);
      (**(code **)(lVar5 + 0x30))(0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBeginTransformFeedback() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe3b);
      (**(code **)(lVar5 + 0x538))(0xe,0,1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glDrawArrays() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe40);
      (**(code **)(lVar5 + 0x638))();
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glEndTransformFeedback() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe43);
      lVar6 = (**(code **)(lVar5 + 0xd00))(0x8c8e,0,uVar13,1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe49);
      lVar7 = uVar13 / 0x18 + 1;
      pfVar2 = (float *)(lVar6 + 0xc);
      while (value = pfVar2, lVar7 = lVar7 + -1, lVar7 != 0) {
        fVar14 = value[-1] - local_1e8;
        fVar15 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar15 = fVar14;
        }
        if (1e-05 < fVar15) goto LAB_00d1f443;
        fVar14 = *value - fStack_1e4;
        fVar15 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar15 = fVar14;
        }
        pfVar2 = value + 6;
        if (1e-05 < fVar15) {
LAB_00d1f443:
          TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                    (&vertex_spacing_mode_string,
                     (TessellationShaderUtils *)(ulong)p_Var11->vertex_spacing,uVar12 % 0x18);
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,
                          "Invalid inner/outer tessellation level used in TE stage;");
          std::operator<<((ostream *)this_00," expected outer:(");
          std::ostream::operator<<(this_00,local_1e8);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,fStack_1e4);
          std::operator<<((ostream *)this_00,") ");
          std::operator<<((ostream *)this_00," rendered outer:(");
          pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value + -1);
          std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
          poVar1 = &pMVar8->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          " vertex spacing mode: ");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          vertex_spacing_mode_string._M_dataplus._M_p);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,"Invalid inner/outer tessellation level used in TE stage",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xe63);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      (**(code **)(lVar5 + 0x1670))(0x8c8e);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe69);
    }
    p_Var11 = p_Var11 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_TessLevel::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize ES test objects */
	initTest();

	/* Our program object takes a single vertex per patch */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Prepare for rendering */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

	/* We will iterate through all added tests. */
	for (_tests_const_iterator test_iterator = m_tests.begin(); test_iterator != m_tests.end(); ++test_iterator)
	{
		/* Iterate through a few different inner/outer tessellation level combinations */
		glw::GLfloat tessellation_level_combinations[] = {
			/* inner[0] */ /* inner[1] */ /* outer[0] */ /* outer[1] */ /* outer[2] */ /* outer[3] */
			1.1f, 1.4f, 2.7f, 3.1f, 4.4f, 5.7f, 64.2f, 32.5f, 16.8f, 8.2f, 4.5f, 2.8f, 3.3f, 6.6f, 9.9f, 12.3f, 15.6f,
			18.9f
		};
		const unsigned int n_tessellation_level_combinations = sizeof(tessellation_level_combinations) /
															   sizeof(tessellation_level_combinations[0]) /
															   6; /* 2 inner + 4 outer levels */

		for (unsigned int n_combination = 0; n_combination < n_tessellation_level_combinations; ++n_combination)
		{
			glw::GLfloat inner_tess_level[] = { tessellation_level_combinations[n_combination * 6 + 0],
												tessellation_level_combinations[n_combination * 6 + 1] };

			glw::GLfloat outer_tess_level[] = { tessellation_level_combinations[n_combination * 6 + 2],
												tessellation_level_combinations[n_combination * 6 + 3],
												tessellation_level_combinations[n_combination * 6 + 4],
												tessellation_level_combinations[n_combination * 6 + 5] };

			/* Test type determines how the tessellation levels should be set. */
			gl.useProgram(test_iterator->po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

			switch (test_iterator->type)
			{
			case TESSELLATION_TEST_TYPE_TCS_TES:
			{
				gl.uniform2fv(test_iterator->inner_tess_levels_uniform_location, 1, /* count */
							  inner_tess_level);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2fv() call failed");

				gl.uniform4fv(test_iterator->outer_tess_levels_uniform_location, 1, /* count */
							  outer_tess_level);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed");

				break;
			}

			case TESSELLATION_TEST_TYPE_TES:
			{
				if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
				{
					gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, inner_tess_level);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() call failed for"
													   " GL_PATCH_DEFAULT_INNER_LEVEL pname");

					gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, outer_tess_level);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() call failed for"
													   " GL_PATCH_DEFAULT_OUTER_LEVEL pname");
				}
				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized test type");
			}
			} /* switch (test_iterator->type) */

			/* Set up storage properties for the buffer object, to which XFBed data will be
			 * written:
			 *
			 * op(Outer[0])   tells how many times amount of points should be multiplied.
			 * op(Outer[1])+1 tells how many points we will receive.
			 *
			 * where op() defines an operator, behavior of which is determined by the vertex
			 * ordering mode specified in tessellation evaluation shader.
			 *
			 * Hence, we should be expecting Outer[0] * (Outer[1] + 1) points.
			 **/
			float outer_level0_clamped = 0.0f;
			float outer_level1_clamped = 0.0f;

			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
				TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, outer_tess_level[0], m_gl_max_tess_gen_level_value,
				DE_NULL, /* out_clamped */
				&outer_level0_clamped);
			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
				test_iterator->vertex_spacing, outer_tess_level[1], m_gl_max_tess_gen_level_value,
				DE_NULL, /* out_clamped */
				&outer_level1_clamped);

			const unsigned int n_bytes_needed = static_cast<unsigned int>(
				(unsigned int)(outer_level0_clamped) * (unsigned int)(outer_level1_clamped + 1) *
				(2 /* vec2 */ + 4 /* vec4 */) * sizeof(float));

			gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, n_bytes_needed, NULL /* data */, GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

			/* Render the test geometry */
			gl.beginTransformFeedback(GL_POINTS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");
			{
				/* A single vertex will do, since we configured GL_PATCH_VERTICES_EXT to be 1 */
				gl.drawArrays(GL_PATCHES_EXT, 0 /* first */, 1 /* count */);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
			}
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

			/* Now that the BO is filled with data, map it so we can check the storage's contents */
			const float* mapped_data_ptr = (const float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																		   n_bytes_needed, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the contents. For each result vertex, inner/outer tessellation levels should
			 * be unchanged. */
			const float		   epsilon = (float)1e-5;
			const unsigned int n_result_points =
				static_cast<unsigned int>(n_bytes_needed / sizeof(float) / (2 /* vec2 */ + 4 /* vec4 */));

			for (unsigned int n_point = 0; n_point < n_result_points; ++n_point)
			{
				const float* point_data_ptr = mapped_data_ptr + (2 /* vec2 */ + 4 /* vec4 */) * n_point;

				if (de::abs(point_data_ptr[2] - outer_tess_level[0]) > epsilon ||
					de::abs(point_data_ptr[3] - outer_tess_level[1]) > epsilon)
				{
					std::string vertex_spacing_mode_string =
						TessellationShaderUtils::getESTokenForVertexSpacingMode(test_iterator->vertex_spacing);

					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid inner/outer tessellation level used in TE stage;"
									   << " expected outer:(" << outer_tess_level[0] << ", " << outer_tess_level[1]
									   << ") "
									   << " rendered outer:(" << point_data_ptr[2] << ", " << point_data_ptr[3] << ")"
									   << " vertex spacing mode: " << vertex_spacing_mode_string.c_str()
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Invalid inner/outer tessellation level used in TE stage");
				}
			} /* for (all points) */

			/* All done - unmap the storage */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (all tess level combinations) */
	}	 /* for (all tests) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}